

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall capnp::List<bool,_(capnp::Kind)0>::Builder::set(Builder *this,uint index,bool value)

{
  uint index_00;
  bool value_local;
  uint index_local;
  Builder *this_local;
  
  index_00 = bounded<unsigned_int>(index);
  _::ListBuilder::setDataElement<bool>(&this->builder,index_00,value);
  return;
}

Assistant:

inline void set(uint index, T value) {
      // Alas, it is not possible to make operator[] return a reference to which you can assign,
      // since the encoded representation does not necessarily match the compiler's representation
      // of the type.  We can't even return a clever class that implements operator T() and
      // operator=() because it will lead to surprising behavior when using type inference (e.g.
      // calling a template function with inferred argument types, or using "auto" or "decltype").

      builder.template setDataElement<T>(bounded(index) * ELEMENTS, value);
    }